

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEditor.cxx
# Opt level: O3

void CodeEditor::style_update
               (int pos,int nInserted,int nDeleted,int param_4,char *param_5,void *cbArg)

{
  char cVar1;
  uint pos_00;
  int iVar2;
  fd_set *text;
  char *text_00;
  char *style;
  undefined4 in_register_0000000c;
  fd_set *__writefds;
  timeval *ptVar3;
  
  __writefds = (fd_set *)CONCAT44(in_register_0000000c,param_4);
  if (nDeleted != 0 || nInserted != 0) {
    ptVar3 = (timeval *)cbArg;
    if (nInserted < 1) {
      Fl_Text_Buffer::remove(*(Fl_Text_Buffer **)((long)cbArg + 0xd8),(char *)(ulong)(uint)pos);
    }
    else {
      text = (fd_set *)operator_new__((ulong)(nInserted + 1));
      memset(text,0x41,(ulong)(uint)nInserted);
      *(char *)((long)text->fds_bits + (ulong)(uint)nInserted) = '\0';
      __writefds = text;
      Fl_Text_Buffer::replace
                (*(Fl_Text_Buffer **)((long)cbArg + 0xd8),pos,nDeleted + pos,(char *)text);
      operator_delete__(text);
    }
    Fl_Text_Buffer::select
              (*(Fl_Text_Buffer **)((long)cbArg + 0xd8),pos,
               (fd_set *)(ulong)(uint)((nInserted + pos) - nDeleted),__writefds,(fd_set *)param_5,
               ptVar3);
    pos_00 = Fl_Text_Buffer::line_start(*(Fl_Text_Buffer **)((long)cbArg + 0xd0),pos);
    iVar2 = Fl_Text_Buffer::prev_char(*(Fl_Text_Buffer **)((long)cbArg + 0xd0),pos_00);
    if (0 < iVar2) {
      iVar2 = Fl_Text_Buffer::prev_char(*(Fl_Text_Buffer **)((long)cbArg + 0xd0),iVar2);
      if (-1 < iVar2) {
        cVar1 = Fl_Text_Buffer::byte_at(*(Fl_Text_Buffer **)((long)cbArg + 0xd8),pos_00 - 2);
        if (cVar1 == 'C') {
          pos_00 = Fl_Text_Buffer::line_start(*(Fl_Text_Buffer **)((long)cbArg + 0xd0),iVar2);
        }
      }
    }
    iVar2 = Fl_Text_Buffer::line_end(*(Fl_Text_Buffer **)((long)cbArg + 0xd0),nInserted + pos);
    text_00 = Fl_Text_Buffer::text_range(*(Fl_Text_Buffer **)((long)cbArg + 0xd0),pos_00,iVar2);
    style = Fl_Text_Buffer::text_range(*(Fl_Text_Buffer **)((long)cbArg + 0xd8),pos_00,iVar2);
    cVar1 = '\0';
    if (iVar2 - pos_00 != 0) {
      cVar1 = style[(int)(~pos_00 + iVar2)];
    }
    style_parse(text_00,style,iVar2 - pos_00);
    Fl_Text_Buffer::replace(*(Fl_Text_Buffer **)((long)cbArg + 0xd8),pos_00,iVar2,style);
    Fl_Text_Display::redisplay_range((Fl_Text_Display *)cbArg,pos_00,iVar2);
    if ((iVar2 - pos_00 == 0) || (cVar1 != style[(long)(int)(iVar2 - pos_00) + -1])) {
      free(text_00);
      free(style);
      iVar2 = (*(Fl_Text_Buffer **)((long)cbArg + 0xd0))->mLength;
      text_00 = Fl_Text_Buffer::text_range(*(Fl_Text_Buffer **)((long)cbArg + 0xd0),pos_00,iVar2);
      style = Fl_Text_Buffer::text_range(*(Fl_Text_Buffer **)((long)cbArg + 0xd8),pos_00,iVar2);
      style_parse(text_00,style,iVar2 - pos_00);
      Fl_Text_Buffer::replace(*(Fl_Text_Buffer **)((long)cbArg + 0xd8),pos_00,iVar2,style);
      Fl_Text_Display::redisplay_range((Fl_Text_Display *)cbArg,pos_00,iVar2);
    }
    free(text_00);
    free(style);
    return;
  }
  Fl_Text_Buffer::unselect(*(Fl_Text_Buffer **)((long)cbArg + 0xd8));
  return;
}

Assistant:

void CodeEditor::style_update(int pos, int nInserted, int nDeleted,
                              int /*nRestyled*/, const char * /*deletedText*/,
                              void *cbArg) {
  CodeEditor	*editor = (CodeEditor *)cbArg;
  int		start,				// Start of text
		end;				// End of text
  char		last,				// Last style on line
		*style,				// Style data
		*text;				// Text data


  // If this is just a selection change, just unselect the style buffer...
  if (nInserted == 0 && nDeleted == 0) {
    editor->mStyleBuffer->unselect();
    return;
  }

  // Track changes in the text buffer...
  if (nInserted > 0) {
    // Insert characters into the style buffer...
    style = new char[nInserted + 1];
    memset(style, 'A', nInserted);
    style[nInserted] = '\0';

    editor->mStyleBuffer->replace(pos, pos + nDeleted, style);
    delete[] style;
  } else {
    // Just delete characters in the style buffer...
    editor->mStyleBuffer->remove(pos, pos + nDeleted);
  }

  // Select the area that was just updated to avoid unnecessary
  // callbacks...
  editor->mStyleBuffer->select(pos, pos + nInserted - nDeleted);

  // Re-parse the changed region; we do this by parsing from the
  // beginning of the line of the changed region to the end of
  // the line of the changed region...  Then we check the last
  // style character and keep updating if we have a multi-line
  // comment character...
  start = editor->mBuffer->line_start(pos);
  // the following code checks the style of the last character of the previous
  // line. If it is a block comment, the previous line is interpreted as well.
  int altStart = editor->mBuffer->prev_char(start);
  if (altStart>0) {
    altStart = editor->mBuffer->prev_char(altStart);
    if (altStart>=0 && editor->mStyleBuffer->byte_at(start-2)=='C')
      start = editor->mBuffer->line_start(altStart);
  }
  end   = editor->mBuffer->line_end(pos + nInserted);
  text  = editor->mBuffer->text_range(start, end);
  style = editor->mStyleBuffer->text_range(start, end);
  if (start==end)
    last = 0;
  else
    last  = style[end - start - 1];

  style_parse(text, style, end - start);

  editor->mStyleBuffer->replace(start, end, style);
  editor->redisplay_range(start, end);

  if (start==end || last != style[end - start - 1]) {
    // The last character on the line changed styles, so reparse the
    // remainder of the buffer...
    free(text);
    free(style);

    end   = editor->mBuffer->length();
    text  = editor->mBuffer->text_range(start, end);
    style = editor->mStyleBuffer->text_range(start, end);

    style_parse(text, style, end - start);

    editor->mStyleBuffer->replace(start, end, style);
    editor->redisplay_range(start, end);
  }

  free(text);
  free(style);
}